

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O1

bool google::protobuf::compiler::cpp::MaybeBootstrap
               (Options *options,GeneratorContext *generator_context,bool bootstrap_flag,
               string *basename)

{
  long lVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long *plVar6;
  undefined4 extraout_var_03;
  Printer printer;
  string forward_to_basename;
  string bootstrap_basename;
  Printer local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  ZeroCopyOutputStream *pZVar5;
  undefined4 extraout_var_02;
  
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  bVar3 = GetBootstrapBasename(options,basename,&local_50);
  if (bVar3) {
    if (!bootstrap_flag) {
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,local_50._M_dataplus._M_p,
                 local_50._M_dataplus._M_p + local_50._M_string_length);
      local_130._0_8_ = (long)&local_130 + 0x10;
      pcVar2 = (basename->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_130,pcVar2,pcVar2 + basename->_M_string_length);
      std::__cxx11::string::append(&local_130.variable_delimiter_);
      iVar4 = (*generator_context->_vptr_GeneratorContext[2])(generator_context,&local_130);
      pZVar5 = (ZeroCopyOutputStream *)CONCAT44(extraout_var,iVar4);
      if (local_130._0_8_ != (long)&local_130 + 0x10U) {
        operator_delete((void *)local_130._0_8_);
      }
      io::Printer::Printer(&local_130,pZVar5,'$',(AnnotationCollector *)0x0);
      FilenameIdentifier(&local_70,basename);
      io::Printer::Print<char[20],std::__cxx11::string,char[20],std::__cxx11::string>
                (&local_130,
                 "#ifndef PROTOBUF_INCLUDED_$filename_identifier$_FORWARD_PB_H\n#define PROTOBUF_INCLUDED_$filename_identifier$_FORWARD_PB_H\n#include \"$forward_to_basename$.pb.h\"  // IWYU pragma: export\n#endif  // PROTOBUF_INCLUDED_$filename_identifier$_FORWARD_PB_H\n"
                 ,(char (*) [20])"forward_to_basename",&local_90,
                 (char (*) [20])"filename_identifier",&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      if (options->opensource_runtime == false) {
        iVar4 = std::__cxx11::string::compare((char *)basename);
        if (iVar4 == 0) {
          io::Printer::Print<char[20],std::__cxx11::string>
                    (&local_130,
                     "#ifdef SWIG\n%include \"$forward_to_basename$.pb.h\"\n#endif  // SWIG\n",
                     (char (*) [20])"forward_to_basename",&local_90);
        }
      }
      io::Printer::~Printer(&local_130);
      lVar1 = (long)&local_130 + 0x10;
      if (pZVar5 != (ZeroCopyOutputStream *)0x0) {
        (*pZVar5->_vptr_ZeroCopyOutputStream[1])(pZVar5);
      }
      pcVar2 = (basename->_M_dataplus)._M_p;
      local_130._0_8_ = lVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_130,pcVar2,pcVar2 + basename->_M_string_length);
      std::__cxx11::string::append(&local_130.variable_delimiter_);
      iVar4 = (*generator_context->_vptr_GeneratorContext[2])(generator_context,&local_130);
      pZVar5 = (ZeroCopyOutputStream *)CONCAT44(extraout_var_00,iVar4);
      if (local_130._0_8_ != lVar1) {
        operator_delete((void *)local_130._0_8_);
      }
      io::Printer::Printer(&local_130,pZVar5,'$',(AnnotationCollector *)0x0);
      FilenameIdentifier(&local_70,basename);
      io::Printer::Print<char[20],std::__cxx11::string,char[20],std::__cxx11::string>
                (&local_130,
                 "#ifndef PROTOBUF_INCLUDED_$filename_identifier$_FORWARD_PROTO_H\n#define PROTOBUF_INCLUDED_$filename_identifier$_FORWARD_PROTO_H\n#include \"$forward_to_basename$.proto.h\"  // IWYU pragma: export\n#endif  // PROTOBUF_INCLUDED_$filename_identifier$_FORWARD_PROTO_H\n"
                 ,(char (*) [20])"forward_to_basename",&local_90,
                 (char (*) [20])"filename_identifier",&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      io::Printer::~Printer(&local_130);
      if (pZVar5 != (ZeroCopyOutputStream *)0x0) {
        (*pZVar5->_vptr_ZeroCopyOutputStream[1])(pZVar5);
      }
      pcVar2 = (basename->_M_dataplus)._M_p;
      local_130._0_8_ = lVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_130,pcVar2,pcVar2 + basename->_M_string_length);
      std::__cxx11::string::append(&local_130.variable_delimiter_);
      iVar4 = (*generator_context->_vptr_GeneratorContext[2])(generator_context,&local_130);
      pZVar5 = (ZeroCopyOutputStream *)CONCAT44(extraout_var_01,iVar4);
      if (local_130._0_8_ != lVar1) {
        operator_delete((void *)local_130._0_8_);
      }
      io::Printer::Printer(&local_130,pZVar5,'$',(AnnotationCollector *)0x0);
      io::Printer::Print<>(&local_130,"\n");
      io::Printer::~Printer(&local_130);
      if (pZVar5 != (ZeroCopyOutputStream *)0x0) {
        (*pZVar5->_vptr_ZeroCopyOutputStream[1])(pZVar5);
      }
      pcVar2 = (basename->_M_dataplus)._M_p;
      local_130._0_8_ = lVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_130,pcVar2,pcVar2 + basename->_M_string_length);
      std::__cxx11::string::append(&local_130.variable_delimiter_);
      iVar4 = (*generator_context->_vptr_GeneratorContext[2])(generator_context,&local_130);
      plVar6 = (long *)CONCAT44(extraout_var_02,iVar4);
      if (local_130._0_8_ != lVar1) {
        operator_delete((void *)local_130._0_8_);
      }
      if (plVar6 != (long *)0x0) {
        (**(code **)(*plVar6 + 8))(plVar6);
      }
      pcVar2 = (basename->_M_dataplus)._M_p;
      local_130._0_8_ = lVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_130,pcVar2,pcVar2 + basename->_M_string_length);
      std::__cxx11::string::append(&local_130.variable_delimiter_);
      iVar4 = (*generator_context->_vptr_GeneratorContext[2])(generator_context,&local_130);
      plVar6 = (long *)CONCAT44(extraout_var_03,iVar4);
      if (local_130._0_8_ != lVar1) {
        operator_delete((void *)local_130._0_8_);
      }
      if (plVar6 != (long *)0x0) {
        (**(code **)(*plVar6 + 8))(plVar6);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      bVar3 = true;
      goto LAB_00242694;
    }
    std::__cxx11::string::_M_assign((string *)basename);
  }
  bVar3 = false;
LAB_00242694:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return bVar3;
}

Assistant:

bool MaybeBootstrap(const Options& options, GeneratorContext* generator_context,
                    bool bootstrap_flag, std::string* basename) {
  std::string bootstrap_basename;
  if (!GetBootstrapBasename(options, *basename, &bootstrap_basename)) {
    return false;
  }

  if (bootstrap_flag) {
    // Adjust basename, but don't abort code generation.
    *basename = bootstrap_basename;
    return false;
  } else {
    std::string forward_to_basename = bootstrap_basename;

    // Generate forwarding headers and empty .pb.cc.
    {
      std::unique_ptr<io::ZeroCopyOutputStream> output(
          generator_context->Open(*basename + ".pb.h"));
      io::Printer printer(output.get(), '$', nullptr);
      printer.Print(
          "#ifndef PROTOBUF_INCLUDED_$filename_identifier$_FORWARD_PB_H\n"
          "#define PROTOBUF_INCLUDED_$filename_identifier$_FORWARD_PB_H\n"
          "#include \"$forward_to_basename$.pb.h\"  // IWYU pragma: export\n"
          "#endif  // PROTOBUF_INCLUDED_$filename_identifier$_FORWARD_PB_H\n",
          "forward_to_basename", forward_to_basename, "filename_identifier",
          FilenameIdentifier(*basename));

      if (!options.opensource_runtime) {
        // HACK HACK HACK, tech debt from the deeps of proto1 and SWIG
        // protocoltype is SWIG'ed and we need to forward
        if (*basename == "net/proto/protocoltype") {
          printer.Print(
              "#ifdef SWIG\n"
              "%include \"$forward_to_basename$.pb.h\"\n"
              "#endif  // SWIG\n",
              "forward_to_basename", forward_to_basename);
        }
      }
    }

    {
      std::unique_ptr<io::ZeroCopyOutputStream> output(
          generator_context->Open(*basename + ".proto.h"));
      io::Printer printer(output.get(), '$', nullptr);
      printer.Print(
          "#ifndef PROTOBUF_INCLUDED_$filename_identifier$_FORWARD_PROTO_H\n"
          "#define PROTOBUF_INCLUDED_$filename_identifier$_FORWARD_PROTO_H\n"
          "#include \"$forward_to_basename$.proto.h\"  // IWYU pragma: "
          "export\n"
          "#endif  // "
          "PROTOBUF_INCLUDED_$filename_identifier$_FORWARD_PROTO_H\n",
          "forward_to_basename", forward_to_basename, "filename_identifier",
          FilenameIdentifier(*basename));
    }

    {
      std::unique_ptr<io::ZeroCopyOutputStream> output(
          generator_context->Open(*basename + ".pb.cc"));
      io::Printer printer(output.get(), '$', nullptr);
      printer.Print("\n");
    }

    {
      std::unique_ptr<io::ZeroCopyOutputStream> output(
          generator_context->Open(*basename + ".pb.h.meta"));
    }

    {
      std::unique_ptr<io::ZeroCopyOutputStream> output(
          generator_context->Open(*basename + ".proto.h.meta"));
    }

    // Abort code generation.
    return true;
  }
}